

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ImTextureID pvVar8;
  ImDrawCmd *pIVar9;
  ImDrawCmd *__dest;
  int iVar10;
  int iVar11;
  
  fVar1 = (this->_CmdHeader).ClipRect.x;
  fVar2 = (this->_CmdHeader).ClipRect.z;
  if (fVar1 <= fVar2) {
    fVar3 = (this->_CmdHeader).ClipRect.y;
    fVar4 = (this->_CmdHeader).ClipRect.w;
    if (fVar3 <= fVar4) {
      pvVar8 = (this->_CmdHeader).TextureId;
      uVar5 = (this->_CmdHeader).VtxOffset;
      uVar6 = (this->IdxBuffer).Size;
      iVar11 = (this->CmdBuffer).Size;
      iVar7 = (this->CmdBuffer).Capacity;
      if (iVar11 == iVar7) {
        iVar11 = iVar11 + 1;
        if (iVar7 == 0) {
          iVar10 = 8;
        }
        else {
          iVar10 = iVar7 / 2 + iVar7;
        }
        if (iVar11 < iVar10) {
          iVar11 = iVar10;
        }
        if (iVar7 < iVar11) {
          __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar11 * 0x38);
          pIVar9 = (this->CmdBuffer).Data;
          if (pIVar9 != (ImDrawCmd *)0x0) {
            memcpy(__dest,pIVar9,(long)(this->CmdBuffer).Size * 0x38);
            ImGui::MemFree((this->CmdBuffer).Data);
          }
          (this->CmdBuffer).Data = __dest;
          (this->CmdBuffer).Capacity = iVar11;
        }
      }
      pIVar9 = (this->CmdBuffer).Data;
      iVar11 = (this->CmdBuffer).Size;
      pIVar9[iVar11].ClipRect.x = fVar1;
      pIVar9[iVar11].ClipRect.y = fVar3;
      pIVar9[iVar11].ClipRect.z = fVar2;
      pIVar9[iVar11].ClipRect.w = fVar4;
      pIVar9[iVar11].TextureId = pvVar8;
      pIVar9[iVar11].VtxOffset = uVar5;
      pIVar9[iVar11].IdxOffset = uVar6;
      *(undefined8 *)&pIVar9[iVar11].ElemCount = 0;
      *(ImDrawCallback *)(&pIVar9[iVar11].ElemCount + 2) = (ImDrawCallback)0x0;
      pIVar9[iVar11].UserCallbackData = (void *)0x0;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
      return;
    }
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                ,0x1cb,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = _CmdHeader.ClipRect;    // Same as calling ImDrawCmd_HeaderCopy()
    draw_cmd.TextureId = _CmdHeader.TextureId;
    draw_cmd.VtxOffset = _CmdHeader.VtxOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}